

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O2

int TestRptrXmmEncoding(CodeGenGenericContext *ctx,uchar *stream,x86Command op,
                       _func_int_uchar_ptr_x86Size_x86Reg_int_x86Reg_int_x86XmmReg *fun,
                       uint testSize)

{
  x86Reg xVar1;
  x86Reg xVar2;
  x86XmmReg xVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  x86Reg *pxVar8;
  long lVar9;
  uchar *local_78;
  int local_40;
  
  local_78 = stream;
  for (lVar9 = 0; lVar9 != 6; lVar9 = lVar9 + 1) {
    for (lVar7 = 0; lVar7 != 9; lVar7 = lVar7 + 1) {
      pxVar8 = testBaseRegs;
      for (lVar6 = 0; lVar6 != 10; lVar6 = lVar6 + 1) {
        if (((int)lVar6 != 0 || (int)lVar7 != 0) && (testSize & 1) != 0) {
          xVar1 = testIndexRegs[lVar7];
          xVar2 = *pxVar8;
          xVar3 = testXmmRegs[lVar9];
          EMIT_OP_RPTR_REG(ctx,op,sDWORD,xVar1,1,xVar2,0,xVar3);
          iVar4 = (*fun)(local_78,sDWORD,xVar1,1,xVar2,0,xVar3);
          local_78 = local_78 + iVar4;
          EMIT_OP_RPTR_REG(ctx,op,sDWORD,xVar1,1,xVar2,4,xVar3);
          iVar4 = (*fun)(local_78,sDWORD,xVar1,1,xVar2,4,xVar3);
          EMIT_OP_RPTR_REG(ctx,op,sDWORD,xVar1,1,xVar2,0x400,xVar3);
          iVar5 = (*fun)(local_78 + iVar4,sDWORD,xVar1,1,xVar2,0x400,xVar3);
          local_78 = local_78 + iVar4 + iVar5;
          if (lVar7 != 0) {
            EMIT_OP_RPTR_REG(ctx,op,sDWORD,xVar1,2,xVar2,0,xVar3);
            iVar4 = (*fun)(local_78,sDWORD,xVar1,2,xVar2,0,xVar3);
            local_78 = local_78 + iVar4;
            EMIT_OP_RPTR_REG(ctx,op,sDWORD,xVar1,2,xVar2,4,xVar3);
            iVar4 = (*fun)(local_78,sDWORD,xVar1,2,xVar2,4,xVar3);
            EMIT_OP_RPTR_REG(ctx,op,sDWORD,xVar1,2,xVar2,0x400,xVar3);
            iVar5 = (*fun)(local_78 + iVar4,sDWORD,xVar1,2,xVar2,0x400,xVar3);
            local_78 = local_78 + iVar4 + iVar5;
          }
        }
        if ((testSize & 2) != 0 && ((int)lVar6 != 0 || (int)lVar7 != 0)) {
          xVar1 = testIndexRegs[lVar7];
          xVar2 = *pxVar8;
          xVar3 = testXmmRegs[lVar9];
          EMIT_OP_RPTR_REG(ctx,op,sQWORD,xVar1,1,xVar2,0,xVar3);
          iVar4 = (*fun)(local_78,sQWORD,xVar1,1,xVar2,0,xVar3);
          local_78 = local_78 + iVar4;
          EMIT_OP_RPTR_REG(ctx,op,sQWORD,xVar1,1,xVar2,4,xVar3);
          iVar4 = (*fun)(local_78,sQWORD,xVar1,1,xVar2,4,xVar3);
          EMIT_OP_RPTR_REG(ctx,op,sQWORD,xVar1,1,xVar2,0x400,xVar3);
          iVar5 = (*fun)(local_78 + iVar4,sQWORD,xVar1,1,xVar2,0x400,xVar3);
          local_78 = local_78 + iVar4 + iVar5;
          if (lVar7 != 0) {
            EMIT_OP_RPTR_REG(ctx,op,sQWORD,xVar1,2,xVar2,0,xVar3);
            iVar4 = (*fun)(local_78,sQWORD,xVar1,2,xVar2,0,xVar3);
            local_78 = local_78 + iVar4;
            EMIT_OP_RPTR_REG(ctx,op,sQWORD,xVar1,2,xVar2,4,xVar3);
            iVar4 = (*fun)(local_78,sQWORD,xVar1,2,xVar2,4,xVar3);
            EMIT_OP_RPTR_REG(ctx,op,sQWORD,xVar1,2,xVar2,0x400,xVar3);
            iVar5 = (*fun)(local_78 + iVar4,sQWORD,xVar1,2,xVar2,0x400,xVar3);
            local_78 = local_78 + iVar4 + iVar5;
          }
        }
        pxVar8 = pxVar8 + 1;
      }
    }
  }
  local_40 = (int)stream;
  return (int)local_78 - local_40;
}

Assistant:

int TestRptrXmmEncoding(CodeGenGenericContext &ctx, unsigned char *stream, x86Command op, int (*fun)(unsigned char *stream, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift, x86XmmReg src), unsigned testSize = testSizeDword | testSizeQword)
{
	unsigned char *start = stream;

	for(unsigned xmm = 0; xmm < sizeof(testXmmRegs) / sizeof(testXmmRegs[0]); xmm++)
	{
		for(unsigned index = 0; index < sizeof(testIndexRegs) / sizeof(testIndexRegs[0]); index++)
		{
			for(unsigned base = 0; base < sizeof(testBaseRegs) / sizeof(testBaseRegs[0]); base++)
			{
				if(testSize & testSizeDword)
				{
					// skip RDI-based addressing
					if(testIndexRegs[index] != rNONE || testBaseRegs[base] != rNONE)
					{
						EMIT_OP_RPTR_REG(ctx, op, sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 0, testXmmRegs[xmm]);
						stream += fun(stream, sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 0, testXmmRegs[xmm]);
						EMIT_OP_RPTR_REG(ctx, op, sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 4, testXmmRegs[xmm]);
						stream += fun(stream, sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 4, testXmmRegs[xmm]);
						EMIT_OP_RPTR_REG(ctx, op, sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 1024, testXmmRegs[xmm]);
						stream += fun(stream, sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 1024, testXmmRegs[xmm]);
					}

					if(testIndexRegs[index] != rNONE)
					{
						EMIT_OP_RPTR_REG(ctx, op, sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 0, testXmmRegs[xmm]);
						stream += fun(stream, sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 0, testXmmRegs[xmm]);
						EMIT_OP_RPTR_REG(ctx, op, sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 4, testXmmRegs[xmm]);
						stream += fun(stream, sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 4, testXmmRegs[xmm]);
						EMIT_OP_RPTR_REG(ctx, op, sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 1024, testXmmRegs[xmm]);
						stream += fun(stream, sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 1024, testXmmRegs[xmm]);
					}
				}

				if(testSize & testSizeQword)
				{
					// skip RDI-based addressing
					if(testIndexRegs[index] != rNONE || testBaseRegs[base] != rNONE)
					{
						EMIT_OP_RPTR_REG(ctx, op, sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 0, testXmmRegs[xmm]);
						stream += fun(stream, sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 0, testXmmRegs[xmm]);
						EMIT_OP_RPTR_REG(ctx, op, sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 4, testXmmRegs[xmm]);
						stream += fun(stream, sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 4, testXmmRegs[xmm]);
						EMIT_OP_RPTR_REG(ctx, op, sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 1024, testXmmRegs[xmm]);
						stream += fun(stream, sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 1024, testXmmRegs[xmm]);
					}

					if(testIndexRegs[index] != rNONE)
					{
						EMIT_OP_RPTR_REG(ctx, op, sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 0, testXmmRegs[xmm]);
						stream += fun(stream, sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 0, testXmmRegs[xmm]);
						EMIT_OP_RPTR_REG(ctx, op, sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 4, testXmmRegs[xmm]);
						stream += fun(stream, sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 4, testXmmRegs[xmm]);
						EMIT_OP_RPTR_REG(ctx, op, sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 1024, testXmmRegs[xmm]);
						stream += fun(stream, sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 1024, testXmmRegs[xmm]);
					}
				}
			}
		}
	}

	return int(stream - start);
}